

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanStringTemplateBegin
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *pp)

{
  EncodedCharPtr puVar1;
  EncodedCharPtr puVar2;
  tokens tVar3;
  utf8char_t uVar4;
  
  Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<true,true>
            ((Scanner<UTF8EncodingPolicyBase<false>> *)this,L'`',pp);
  puVar1 = this->m_pchLast;
  puVar2 = *pp;
  *pp = puVar2 + 1;
  if (puVar2 < puVar1) {
    uVar4 = *puVar2;
  }
  else {
    uVar4 = '\0';
  }
  if (uVar4 == '`') {
    tVar3 = tkStrTmplBasic;
  }
  else {
    if (uVar4 == '$') {
      puVar2 = *pp;
      *pp = puVar2 + 1;
      if ((puVar2 < puVar1) && (*puVar2 == '{')) {
        this->m_fStringTemplateDepth = this->m_fStringTemplateDepth + 1;
        return tkStrTmplBegin;
      }
    }
    *pp = *pp + -1;
    this->m_ptoken->tk = tkLastKwd;
    tVar3 = tkLastKwd;
  }
  return tVar3;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringTemplateBegin(EncodedCharPtr *pp)
{
    // String template must begin with a string constant followed by '`' or '${'
    ScanStringConstant<true, true>('`', pp);

    OLECHAR ch;
    EncodedCharPtr last = m_pchLast;

    ch = this->ReadFirst(*pp, last);

    if (ch == '`')
    {
        // Simple string template - no substitutions
        return tkStrTmplBasic;
    }
    else if (ch == '$')
    {
        ch = this->ReadFirst(*pp, last);

        if (ch == '{')
        {
            // Next token after expr should be tkStrTmplMid or tkStrTmplEnd.
            // In string template scanning mode, we expect the next char to be '}'
            // and will treat it as the beginning of tkStrTmplEnd or tkStrTmplMid
            m_fStringTemplateDepth++;

            // Regular string template begin - next is first substitution
            return tkStrTmplBegin;
        }
    }

    // Error - make sure pointer stays at the last character of the error token instead of after it in the error case
    (*pp)--;
    return ScanError(m_currentCharacter, tkStrTmplBegin);
}